

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useSampler
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,deUint32 textureId)

{
  Init textureInit;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Parameters textureParams_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Type textureType_00;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint z_;
  reference this_00;
  TextureBinding *this_01;
  Sampler *refSampler_00;
  Parameters *pPVar15;
  TextureFormat *pTVar16;
  reference pvVar17;
  ConstPixelBufferAccess *pCVar18;
  void *pvVar19;
  InternalError *this_02;
  Parameters *pPVar20;
  bool bVar21;
  CubeFace local_3e4;
  CubeFace local_380;
  CubeFace local_350;
  CubeFace local_320;
  CubeFace local_2bc;
  CubeFace local_284;
  CubeFace local_24c;
  undefined4 local_21c;
  undefined4 uStack_218;
  Vector<unsigned_int,_3> local_204;
  undefined1 local_1f8 [8];
  ConstPixelBufferAccess layerData_2;
  ChannelType local_1c8;
  deUint32 layerOffset_2;
  deUint32 layer_2;
  deUint32 layerSize_2;
  ConstPixelBufferAccess *levelLayers_2;
  deUint32 level_6;
  uint local_1ac;
  TextureCubeArray *local_1a8;
  TextureCubeArray *texture_6;
  ConstPixelBufferAccess layerData_1;
  ChannelType local_170;
  deUint32 layerOffset_1;
  deUint32 layer_1;
  deUint32 layerSize_1;
  ConstPixelBufferAccess *levelLayers_1;
  deUint32 level_5;
  uint local_154;
  Texture1DArray *local_150;
  Texture1DArray *texture_5;
  deUint32 level_4;
  uint local_13c;
  Texture1D *local_138;
  Texture1D *texture_4;
  deUint32 level_3;
  uint local_124;
  Texture3D *local_120;
  Texture3D *texture_3;
  ConstPixelBufferAccess layerData;
  ChannelType local_e8;
  deUint32 layerOffset;
  deUint32 layer;
  deUint32 layerSize;
  ConstPixelBufferAccess *levelLayers;
  deUint32 level_2;
  uint local_cc;
  Texture2DArray *local_c8;
  Texture2DArray *texture_2;
  CubeFace face;
  int faceNdx;
  deUint32 level_1;
  uint local_ac;
  TextureCube *local_a8;
  TextureCube *texture_1;
  uint uStack_98;
  deUint32 level;
  uint local_90;
  Texture2D *local_80;
  Texture2D *texture;
  TextureData textureData;
  uint uStack_58;
  UVec3 texSize;
  TextureFormat texFormat;
  CubeFace local_40;
  deUint32 arrayLayers;
  deUint32 mipLevels;
  bool isMSTexture;
  Parameters *textureParams;
  Sampler *refSampler;
  Type textureType;
  TextureBinding *textureBinding;
  deUint32 textureId_local;
  deUint32 bindingLocation_local;
  ShaderRenderCaseInstance *this_local;
  
  this_00 = std::
            vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
            ::operator[](&this->m_textures,(ulong)textureId);
  this_01 = de::SharedPtr<vkt::sr::TextureBinding>::operator*(this_00);
  textureType_00 = TextureBinding::getType(this_01);
  refSampler_00 = TextureBinding::getSampler(this_01);
  pPVar15 = TextureBinding::getParameters(this_01);
  bVar21 = pPVar15->samples == VK_SAMPLE_COUNT_1_BIT;
  tcu::TextureFormat::TextureFormat((TextureFormat *)(texSize.m_data + 1));
  tcu::Vector<unsigned_int,_3>::Vector
            ((Vector<unsigned_int,_3> *)
             ((long)&textureData.
                     super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ::vector((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            *)&texture);
  if (textureType_00 == TYPE_2D) {
    local_80 = TextureBinding::get2D(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_80->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::Texture2D::getWidth(local_80);
    uVar9 = tcu::Texture2D::getHeight(local_80);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&stack0xffffffffffffff68,uVar8,uVar9,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_98;
    uStack_58 = level;
    texSize.m_data[0] = local_90;
    if (bVar21) {
      local_24c = tcu::TextureLevelPyramid::getNumLevels(&local_80->super_TextureLevelPyramid);
    }
    else {
      local_24c = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_24c;
    texFormat.type = SNORM_INT16;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_24c);
    for (texture_1._4_4_ = CUBEFACE_NEGATIVE_X; texture_1._4_4_ < local_24c;
        texture_1._4_4_ = texture_1._4_4_ + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_80->super_TextureLevelPyramid,texture_1._4_4_);
      if (!bVar21) {
        pvVar17 = std::
                  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                *)&texture,(ulong)texture_1._4_4_);
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_80->super_TextureLevelPyramid,texture_1._4_4_);
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back(pvVar17,pCVar18);
      }
    }
  }
  else if (textureType_00 == TYPE_CUBE_MAP) {
    local_a8 = TextureBinding::getCube(this_01);
    pTVar16 = tcu::TextureCube::getFormat(local_a8);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::TextureCube::getSize(local_a8);
    uVar9 = tcu::TextureCube::getSize(local_a8);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)&faceNdx,uVar8,uVar9,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = faceNdx;
    uStack_58 = level_1;
    texSize.m_data[0] = local_ac;
    if (bVar21) {
      local_284 = tcu::TextureCube::getNumLevels(local_a8);
    }
    else {
      local_284 = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_284;
    texFormat.type = UNORM_INT32;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_284);
    for (face = CUBEFACE_NEGATIVE_X; face < local_284; face = face + CUBEFACE_POSITIVE_X) {
      for (texture_2._4_4_ = 0; texture_2._4_4_ < 6; texture_2._4_4_ = texture_2._4_4_ + 1) {
        texture_2._0_4_ = useSampler::cubeFaceMapping[texture_2._4_4_];
        bVar21 = tcu::TextureCube::isLevelEmpty(local_a8,(CubeFace)texture_2,face);
        if (!bVar21) {
          pvVar17 = std::
                    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                  *)&texture,(ulong)face);
          pCVar18 = tcu::TextureCube::getLevelFace(local_a8,face,(CubeFace)texture_2);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(pvVar17,pCVar18);
        }
      }
    }
  }
  else if (textureType_00 == TYPE_2D_ARRAY) {
    local_c8 = TextureBinding::get2DArray(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_c8->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::Texture2DArray::getWidth(local_c8);
    uVar9 = tcu::Texture2DArray::getHeight(local_c8);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)((long)&levelLayers + 4),uVar8,uVar9,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = levelLayers._4_4_;
    uStack_58 = level_2;
    texSize.m_data[0] = local_cc;
    if (bVar21) {
      local_2bc = tcu::TextureLevelPyramid::getNumLevels(&local_c8->super_TextureLevelPyramid);
    }
    else {
      local_2bc = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_2bc;
    texFormat.type = tcu::Texture2DArray::getNumLayers(local_c8);
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_2bc);
    for (levelLayers._0_4_ = CUBEFACE_NEGATIVE_X; (CubeFace)levelLayers < local_2bc;
        levelLayers._0_4_ = (CubeFace)levelLayers + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_c8->super_TextureLevelPyramid,(CubeFace)levelLayers);
      if (!bVar21) {
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_c8->super_TextureLevelPyramid,(CubeFace)levelLayers);
        iVar10 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
        iVar11 = tcu::ConstPixelBufferAccess::getHeight(pCVar18);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
        iVar12 = tcu::TextureFormat::getPixelSize(pTVar16);
        for (local_e8 = SNORM_INT8; local_e8 < texFormat.type; local_e8 = local_e8 + SNORM_INT16) {
          layerData.m_data._4_4_ = iVar10 * iVar11 * iVar12 * local_e8;
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
          iVar13 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
          iVar14 = tcu::ConstPixelBufferAccess::getHeight(pCVar18);
          pvVar19 = tcu::ConstPixelBufferAccess::getDataPtr(pCVar18);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&texture_3,pTVar16,iVar13,iVar14,1,
                     (void *)((long)pvVar19 + (ulong)layerData.m_data._4_4_));
          pvVar17 = std::
                    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                  *)&texture,(ulong)(CubeFace)levelLayers);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(pvVar17,(value_type *)&texture_3);
        }
      }
    }
  }
  else if (textureType_00 == TYPE_3D) {
    local_120 = TextureBinding::get3D(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_120->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::Texture3D::getWidth(local_120);
    uVar9 = tcu::Texture3D::getHeight(local_120);
    z_ = tcu::Texture3D::getDepth(local_120);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)((long)&texture_4 + 4),uVar8,uVar9,z_);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = texture_4._4_4_;
    uStack_58 = level_3;
    texSize.m_data[0] = local_124;
    if (bVar21) {
      local_320 = tcu::TextureLevelPyramid::getNumLevels(&local_120->super_TextureLevelPyramid);
    }
    else {
      local_320 = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_320;
    texFormat.type = SNORM_INT16;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_320);
    for (texture_4._0_4_ = CUBEFACE_NEGATIVE_X; (CubeFace)texture_4 < local_320;
        texture_4._0_4_ = (CubeFace)texture_4 + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_120->super_TextureLevelPyramid,(CubeFace)texture_4);
      if (!bVar21) {
        pvVar17 = std::
                  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                *)&texture,(ulong)(CubeFace)texture_4);
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_120->super_TextureLevelPyramid,(CubeFace)texture_4);
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back(pvVar17,pCVar18);
      }
    }
  }
  else if (textureType_00 == TYPE_1D) {
    local_138 = TextureBinding::get1D(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_138->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::Texture1D::getWidth(local_138);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)((long)&texture_5 + 4),uVar8,1,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = texture_5._4_4_;
    uStack_58 = level_4;
    texSize.m_data[0] = local_13c;
    if (bVar21) {
      local_350 = tcu::TextureLevelPyramid::getNumLevels(&local_138->super_TextureLevelPyramid);
    }
    else {
      local_350 = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_350;
    texFormat.type = SNORM_INT16;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_350);
    for (texture_5._0_4_ = CUBEFACE_NEGATIVE_X; (CubeFace)texture_5 < local_350;
        texture_5._0_4_ = (CubeFace)texture_5 + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_138->super_TextureLevelPyramid,(CubeFace)texture_5);
      if (!bVar21) {
        pvVar17 = std::
                  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                *)&texture,(ulong)(CubeFace)texture_5);
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_138->super_TextureLevelPyramid,(CubeFace)texture_5);
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back(pvVar17,pCVar18);
      }
    }
  }
  else if (textureType_00 == TYPE_1D_ARRAY) {
    local_150 = TextureBinding::get1DArray(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_150->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::Texture1DArray::getWidth(local_150);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)((long)&levelLayers_1 + 4),uVar8,1,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = levelLayers_1._4_4_;
    uStack_58 = level_5;
    texSize.m_data[0] = local_154;
    if (bVar21) {
      local_380 = tcu::TextureLevelPyramid::getNumLevels(&local_150->super_TextureLevelPyramid);
    }
    else {
      local_380 = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_380;
    texFormat.type = tcu::Texture1DArray::getNumLayers(local_150);
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_380);
    for (levelLayers_1._0_4_ = CUBEFACE_NEGATIVE_X; (CubeFace)levelLayers_1 < local_380;
        levelLayers_1._0_4_ = (CubeFace)levelLayers_1 + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_150->super_TextureLevelPyramid,(CubeFace)levelLayers_1);
      if (!bVar21) {
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_150->super_TextureLevelPyramid,(CubeFace)levelLayers_1);
        iVar10 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
        iVar11 = tcu::TextureFormat::getPixelSize(pTVar16);
        for (local_170 = SNORM_INT8; local_170 < texFormat.type; local_170 = local_170 + SNORM_INT16
            ) {
          layerData_1.m_data._4_4_ = iVar10 * iVar11 * local_170;
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
          iVar12 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
          pvVar19 = tcu::ConstPixelBufferAccess::getDataPtr(pCVar18);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&texture_6,pTVar16,iVar12,1,1,
                     (void *)((long)pvVar19 + (ulong)layerData_1.m_data._4_4_));
          pvVar17 = std::
                    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                  *)&texture,(ulong)(CubeFace)levelLayers_1);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(pvVar17,(value_type *)&texture_6);
        }
      }
    }
  }
  else {
    if (textureType_00 != TYPE_CUBE_ARRAY) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_02,"Invalid texture type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x7c8);
      __cxa_throw(this_02,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    local_1a8 = TextureBinding::getCubeArray(this_01);
    pTVar16 = tcu::TextureLevelPyramid::getFormat(&local_1a8->super_TextureLevelPyramid);
    texSize.m_data._4_8_ = *pTVar16;
    uVar8 = tcu::TextureCubeArray::getSize(local_1a8);
    uVar9 = tcu::TextureCubeArray::getSize(local_1a8);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)((long)&levelLayers_2 + 4),uVar8,uVar9,1);
    textureData.
    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = levelLayers_2._4_4_;
    uStack_58 = level_6;
    texSize.m_data[0] = local_1ac;
    if (bVar21) {
      local_3e4 = tcu::TextureLevelPyramid::getNumLevels(&local_1a8->super_TextureLevelPyramid);
    }
    else {
      local_3e4 = CUBEFACE_POSITIVE_X;
    }
    local_40 = local_3e4;
    texFormat.type = tcu::TextureCubeArray::getDepth(local_1a8);
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              *)&texture,(ulong)local_3e4);
    for (levelLayers_2._0_4_ = CUBEFACE_NEGATIVE_X; (CubeFace)levelLayers_2 < local_3e4;
        levelLayers_2._0_4_ = (CubeFace)levelLayers_2 + CUBEFACE_POSITIVE_X) {
      bVar21 = tcu::TextureLevelPyramid::isLevelEmpty
                         (&local_1a8->super_TextureLevelPyramid,(CubeFace)levelLayers_2);
      if (!bVar21) {
        pCVar18 = tcu::TextureLevelPyramid::getLevel
                            (&local_1a8->super_TextureLevelPyramid,(CubeFace)levelLayers_2);
        iVar10 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
        iVar11 = tcu::ConstPixelBufferAccess::getHeight(pCVar18);
        pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
        iVar12 = tcu::TextureFormat::getPixelSize(pTVar16);
        for (local_1c8 = SNORM_INT8; local_1c8 < texFormat.type; local_1c8 = local_1c8 + SNORM_INT16
            ) {
          layerData_2.m_data._4_4_ = iVar10 * iVar11 * iVar12 * local_1c8;
          pTVar16 = tcu::ConstPixelBufferAccess::getFormat(pCVar18);
          iVar13 = tcu::ConstPixelBufferAccess::getWidth(pCVar18);
          iVar14 = tcu::ConstPixelBufferAccess::getHeight(pCVar18);
          pvVar19 = tcu::ConstPixelBufferAccess::getDataPtr(pCVar18);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_1f8,pTVar16,iVar13,iVar14,1,
                     (void *)((long)pvVar19 + (ulong)layerData_2.m_data._4_4_));
          pvVar17 = std::
                    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ::operator[]((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                  *)&texture,(ulong)(CubeFace)levelLayers_2);
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(pvVar17,(value_type *)local_1f8);
        }
      }
    }
  }
  pPVar20 = TextureBinding::getParameters(this_01);
  textureInit = pPVar20->initialization;
  tcu::Vector<unsigned_int,_3>::Vector
            (&local_204,
             (Vector<unsigned_int,_3> *)
             ((long)&textureData.
                     super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  uVar1 = (pPVar15->componentMapping).b;
  uVar5 = pPVar15->baseMipLevel;
  uVar6 = (pPVar15->componentMapping).r;
  uVar7 = (pPVar15->componentMapping).g;
  textureParams_00.componentMapping.g = uVar7;
  textureParams_00.componentMapping.r = uVar6;
  textureParams_00.baseMipLevel = uVar5;
  uVar2 = (pPVar15->componentMapping).a;
  uVar3 = pPVar15->samples;
  uVar4 = pPVar15->initialization;
  textureParams_00.initialization = uVar4;
  textureParams_00.samples = uVar3;
  textureParams_00.componentMapping.b = uVar1;
  textureParams_00.componentMapping.a = uVar2;
  createSamplerUniform
            (this,bindingLocation,textureType_00,textureInit,(TextureFormat *)(texSize.m_data + 1),
             &local_204,(TextureData *)&texture,refSampler_00,local_40,texFormat.type,
             textureParams_00);
  std::
  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ::~vector((vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
             *)&texture);
  return;
}

Assistant:

void ShaderRenderCaseInstance::useSampler (deUint32 bindingLocation, deUint32 textureId)
{
	DE_ASSERT(textureId < m_textures.size());

	const TextureBinding&				textureBinding		= *m_textures[textureId];
	const TextureBinding::Type			textureType			= textureBinding.getType();
	const tcu::Sampler&					refSampler			= textureBinding.getSampler();
	const TextureBinding::Parameters&	textureParams		= textureBinding.getParameters();
	const bool							isMSTexture			= textureParams.samples != vk::VK_SAMPLE_COUNT_1_BIT;
	deUint32							mipLevels			= 1u;
	deUint32							arrayLayers			= 1u;
	tcu::TextureFormat					texFormat;
	tcu::UVec3							texSize;
	TextureData							textureData;

	if (textureType == TextureBinding::TYPE_2D)
	{
		const tcu::Texture2D&			texture		= textureBinding.get2D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_MAP)
	{
		const tcu::TextureCube&			texture		= textureBinding.getCube();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 6u;

		static const tcu::CubeFace		cubeFaceMapping[tcu::CUBEFACE_LAST] =
		{
			tcu::CUBEFACE_POSITIVE_X,
			tcu::CUBEFACE_NEGATIVE_X,
			tcu::CUBEFACE_POSITIVE_Y,
			tcu::CUBEFACE_NEGATIVE_Y,
			tcu::CUBEFACE_POSITIVE_Z,
			tcu::CUBEFACE_NEGATIVE_Z
		};

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
			{
				tcu::CubeFace face = cubeFaceMapping[faceNdx];

				if (texture.isLevelEmpty(face, level))
					continue;

				textureData[level].push_back(texture.getLevelFace(level, face));
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_2D_ARRAY)
	{
		const tcu::Texture2DArray&		texture		= textureBinding.get2DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_3D)
	{
		const tcu::Texture3D&			texture		= textureBinding.get3D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), texture.getDepth());
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D)
	{
		const tcu::Texture1D&			texture		= textureBinding.get1D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D_ARRAY)
	{
		const tcu::Texture1DArray&		texture		= textureBinding.get1DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), 1, 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_ARRAY)
	{
		const tcu::TextureCubeArray&	texture		= textureBinding.getCubeArray();
		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= texture.getDepth();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else
	{
		TCU_THROW(InternalError, "Invalid texture type");
	}

	createSamplerUniform(bindingLocation, textureType, textureBinding.getParameters().initialization, texFormat, texSize, textureData, refSampler, mipLevels, arrayLayers, textureParams);
}